

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

IVec2 __thiscall
deqp::egl::checkSurfaceSize
          (egl *this,Library *egl,EGLDisplay eglDisplay,EGLSurface eglSurface,
          NativeWindow *nativeWindow,IVec2 *reqSize,ResultCollector *status)

{
  int iVar1;
  int iVar2;
  ostream *stream;
  bool bVar3;
  long lVar4;
  int *piVar5;
  ostringstream oss;
  Vector<int,_2> local_1c8;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  if ((nativeWindow->m_capabilities & CAPABILITY_GET_SURFACE_SIZE) == 0) {
    local_1c8.m_data = *&reqSize->m_data;
  }
  else {
    (*nativeWindow->_vptr_NativeWindow[5])(&local_1c8,nativeWindow);
  }
  eglu::getSurfaceSize((eglu *)this,egl,eglDisplay,eglSurface);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Size of EGL surface ",0x14);
  stream = tcu::operator<<((ostream *)local_1a0,(Vector<int,_2> *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," differs from size of native window ",0x24);
  tcu::operator<<(stream,&local_1c8);
  bVar3 = true;
  lVar4 = 0;
  piVar5 = local_1c8.m_data;
  do {
    iVar1 = *(int *)(this + lVar4 * 4);
    iVar2 = *piVar5;
    if (!bVar3) break;
    lVar4 = 1;
    bVar3 = false;
    piVar5 = local_1c8.m_data + 1;
  } while (iVar1 == iVar2);
  std::__cxx11::stringbuf::str();
  tcu::ResultCollector::check(status,iVar1 == iVar2,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 checkSurfaceSize (const Library&		egl,
						EGLDisplay			eglDisplay,
						EGLSurface			eglSurface,
						const NativeWindow&	nativeWindow,
						IVec2				reqSize,
						ResultCollector&	status)
{
	const IVec2		nativeSize	= getNativeSurfaceSize(nativeWindow, reqSize);
	IVec2			eglSize		= eglu::getSurfaceSize(egl, eglDisplay, eglSurface);
	ostringstream	oss;

	oss << "Size of EGL surface " << eglSize
		<< " differs from size of native window " << nativeSize;
	status.check(eglSize == nativeSize, oss.str());

	return eglSize;
}